

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

bool updateScatterData(double value0,double value1,HighsScatterData *scatter_data)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  
  if (0.0 < value0 && 0.0 < value1) {
    uVar1 = scatter_data->num_point_;
    uVar2 = scatter_data->last_point_;
    iVar4 = uVar2 + 1;
    scatter_data->num_point_ = uVar1 + 1;
    scatter_data->last_point_ = iVar4;
    iVar3 = 0;
    if (iVar4 != scatter_data->max_num_point_) {
      iVar3 = iVar4;
    }
    scatter_data->last_point_ = iVar3;
    (scatter_data->value0_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = value0;
    (scatter_data->value1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = value1;
  }
  return 0.0 < value0 && 0.0 < value1;
}

Assistant:

bool updateScatterData(const double value0, const double value1,
                       HighsScatterData& scatter_data) {
  if (value0 <= 0 || value1 <= 0) return false;
  scatter_data.num_point_++;
  scatter_data.last_point_++;
  if (scatter_data.last_point_ == scatter_data.max_num_point_)
    scatter_data.last_point_ = 0;
  scatter_data.value0_[scatter_data.last_point_] = value0;
  scatter_data.value1_[scatter_data.last_point_] = value1;
  return true;
}